

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O3

void embree::avx::
     BVHNIntersector1<8,_1,_true,_embree::avx::ArrayIntersector1<embree::avx::QuadMvIntersector1Pluecker<4,_true>_>_>
     ::occluded(Intersectors *This,Ray *ray,RayQueryContext *context)

{
  long lVar1;
  float fVar2;
  undefined4 uVar3;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar4;
  Geometry *pGVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  ulong uVar56;
  long lVar57;
  uint uVar58;
  ulong uVar59;
  Scene *pSVar60;
  long lVar61;
  ulong uVar62;
  ulong *puVar63;
  ulong uVar64;
  ulong uVar65;
  ulong uVar66;
  ulong uVar67;
  ulong uVar68;
  undefined1 auVar69 [16];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  float fVar77;
  float fVar78;
  float fVar79;
  float fVar80;
  undefined1 auVar75 [32];
  float fVar81;
  undefined1 auVar76 [32];
  float fVar82;
  float fVar88;
  float fVar89;
  undefined1 auVar83 [16];
  float fVar90;
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  float fVar91;
  float fVar92;
  float fVar93;
  undefined1 auVar87 [64];
  float fVar94;
  float fVar98;
  float fVar99;
  undefined1 auVar95 [16];
  undefined1 auVar96 [32];
  float fVar100;
  float fVar101;
  float fVar102;
  float fVar103;
  undefined1 auVar97 [64];
  float fVar104;
  float fVar105;
  float fVar111;
  float fVar112;
  float fVar113;
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [32];
  float fVar114;
  float fVar115;
  float fVar116;
  float fVar117;
  undefined1 auVar110 [64];
  float fVar118;
  float fVar123;
  float fVar124;
  float fVar125;
  float fVar126;
  float fVar127;
  float fVar128;
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar129 [64];
  float fVar130;
  float fVar131;
  undefined1 auVar132 [32];
  float fVar142;
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  float fVar136;
  float fVar137;
  float fVar138;
  float fVar139;
  float fVar140;
  float fVar141;
  undefined1 auVar135 [64];
  float fVar143;
  float fVar144;
  undefined1 auVar145 [32];
  float fVar147;
  float fVar148;
  float fVar149;
  float fVar150;
  float fVar151;
  float fVar152;
  float fVar153;
  float fVar154;
  float fVar155;
  float fVar156;
  float fVar157;
  float fVar158;
  undefined1 auVar146 [64];
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  undefined1 auVar161 [64];
  float fVar162;
  undefined1 auVar163 [32];
  float fVar165;
  float fVar166;
  float fVar167;
  float fVar168;
  float fVar169;
  float fVar170;
  undefined1 auVar164 [64];
  float fVar171;
  undefined1 auVar172 [32];
  float fVar174;
  float fVar175;
  float fVar176;
  float fVar177;
  float fVar178;
  float fVar179;
  undefined1 auVar173 [64];
  undefined1 auVar180 [32];
  undefined1 auVar181 [64];
  float fVar182;
  undefined1 auVar183 [32];
  float fVar185;
  float fVar186;
  float fVar187;
  float fVar188;
  float fVar189;
  float fVar190;
  undefined1 auVar184 [64];
  float fVar191;
  float fVar192;
  float fVar193;
  float fVar194;
  float fVar195;
  float fVar196;
  float fVar197;
  float fVar198;
  float fVar199;
  float fVar200;
  float fVar201;
  float fVar202;
  float fVar203;
  float fVar204;
  HitK<1> h;
  RTCFilterFunctionNArguments args;
  NodeRef stack [564];
  int local_17ac;
  long local_17a8;
  undefined1 local_17a0 [32];
  undefined8 local_1780;
  float fStack_1778;
  float fStack_1774;
  float fStack_1770;
  float fStack_176c;
  float fStack_1768;
  float fStack_1764;
  undefined4 local_1760;
  float local_175c;
  float local_1758;
  undefined4 local_1754;
  undefined4 local_1750;
  undefined4 local_174c;
  uint local_1748;
  uint local_1744;
  uint local_1740;
  RTCFilterFunctionNArguments local_1730;
  undefined8 local_1700;
  float fStack_16f8;
  float fStack_16f4;
  float fStack_16f0;
  float fStack_16ec;
  float fStack_16e8;
  float fStack_16e4;
  undefined8 local_16e0;
  float fStack_16d8;
  float fStack_16d4;
  float fStack_16d0;
  float fStack_16cc;
  float fStack_16c8;
  float fStack_16c4;
  undefined1 local_16c0 [32];
  undefined1 local_16a0 [32];
  undefined1 local_1680 [32];
  undefined1 local_1660 [32];
  undefined1 local_1640 [32];
  undefined1 local_1620 [32];
  undefined1 local_1600 [32];
  undefined1 local_15e0 [32];
  undefined1 local_15c0 [32];
  undefined1 local_15a0 [32];
  undefined1 local_1580 [32];
  undefined1 local_1560 [32];
  undefined1 local_1540 [32];
  undefined1 local_1520 [32];
  undefined1 local_1500 [32];
  undefined1 local_14e0 [32];
  undefined1 local_14c0 [32];
  undefined1 local_14a0 [32];
  undefined1 local_1480 [32];
  undefined1 local_1460 [32];
  undefined1 local_1440 [32];
  undefined1 local_1420 [8];
  float fStack_1418;
  float fStack_1414;
  float fStack_1410;
  float fStack_140c;
  float fStack_1408;
  undefined8 local_1400;
  undefined8 uStack_13f8;
  undefined8 uStack_13f0;
  undefined8 uStack_13e8;
  undefined8 local_13e0;
  undefined8 uStack_13d8;
  undefined8 uStack_13d0;
  undefined8 uStack_13c8;
  float local_13c0;
  float fStack_13bc;
  float fStack_13b8;
  float fStack_13b4;
  float fStack_13b0;
  float fStack_13ac;
  float fStack_13a8;
  float fStack_13a4;
  float local_13a0;
  float fStack_139c;
  float fStack_1398;
  float fStack_1394;
  float fStack_1390;
  float fStack_138c;
  float fStack_1388;
  float fStack_1384;
  undefined1 local_1380 [32];
  undefined1 local_1360 [32];
  undefined1 local_1340 [32];
  undefined1 local_1320 [32];
  undefined1 local_1300 [32];
  undefined1 local_12e0 [32];
  undefined1 local_12c0 [32];
  undefined1 local_12a0 [32];
  undefined1 local_1280 [32];
  float local_1260 [4];
  float fStack_1250;
  float fStack_124c;
  float fStack_1248;
  undefined4 uStack_1244;
  float local_1240 [4];
  float fStack_1230;
  float fStack_122c;
  float fStack_1228;
  undefined4 uStack_1224;
  undefined1 local_1220 [32];
  ulong local_1200;
  ulong local_11f8 [569];
  undefined1 auVar122 [64];
  
  local_1200 = *(ulong *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_1200 != 8) {
    fVar2 = ray->tfar;
    if (0.0 <= fVar2) {
      puVar63 = local_11f8;
      auVar14 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->org).field_0.m128[3]));
      aVar4 = (ray->dir).field_0;
      auVar69._8_4_ = 0x7fffffff;
      auVar69._0_8_ = 0x7fffffff7fffffff;
      auVar69._12_4_ = 0x7fffffff;
      auVar69 = vandps_avx((undefined1  [16])aVar4,auVar69);
      auVar106._8_4_ = 0x219392ef;
      auVar106._0_8_ = 0x219392ef219392ef;
      auVar106._12_4_ = 0x219392ef;
      auVar69 = vcmpps_avx(auVar69,auVar106,1);
      auVar107._8_4_ = 0x3f800000;
      auVar107._0_8_ = 0x3f8000003f800000;
      auVar107._12_4_ = 0x3f800000;
      auVar106 = vdivps_avx(auVar107,(undefined1  [16])aVar4);
      auVar108._8_4_ = 0x5d5e0b6b;
      auVar108._0_8_ = 0x5d5e0b6b5d5e0b6b;
      auVar108._12_4_ = 0x5d5e0b6b;
      auVar69 = vblendvps_avx(auVar106,auVar108,auVar69);
      auVar95._0_4_ = auVar69._0_4_ * 0.99999964;
      auVar95._4_4_ = auVar69._4_4_ * 0.99999964;
      auVar95._8_4_ = auVar69._8_4_ * 0.99999964;
      auVar95._12_4_ = auVar69._12_4_ * 0.99999964;
      auVar83._0_4_ = auVar69._0_4_ * 1.0000004;
      auVar83._4_4_ = auVar69._4_4_ * 1.0000004;
      auVar83._8_4_ = auVar69._8_4_ * 1.0000004;
      auVar83._12_4_ = auVar69._12_4_ * 1.0000004;
      uVar3 = *(undefined4 *)&(ray->org).field_0;
      auVar129 = ZEXT3264(CONCAT428(uVar3,CONCAT424(uVar3,CONCAT420(uVar3,CONCAT416(uVar3,CONCAT412(
                                                  uVar3,CONCAT48(uVar3,CONCAT44(uVar3,uVar3))))))));
      uVar3 = *(undefined4 *)((long)&(ray->org).field_0 + 4);
      auVar135 = ZEXT3264(CONCAT428(uVar3,CONCAT424(uVar3,CONCAT420(uVar3,CONCAT416(uVar3,CONCAT412(
                                                  uVar3,CONCAT48(uVar3,CONCAT44(uVar3,uVar3))))))));
      uVar3 = *(undefined4 *)((long)&(ray->org).field_0 + 8);
      auVar146 = ZEXT3264(CONCAT428(uVar3,CONCAT424(uVar3,CONCAT420(uVar3,CONCAT416(uVar3,CONCAT412(
                                                  uVar3,CONCAT48(uVar3,CONCAT44(uVar3,uVar3))))))));
      auVar69 = vshufps_avx(auVar95,auVar95,0);
      auVar161 = ZEXT3264(CONCAT1616(auVar69,auVar69));
      auVar69 = vmovshdup_avx(auVar95);
      auVar106 = vshufps_avx(auVar95,auVar95,0x55);
      auVar164 = ZEXT3264(CONCAT1616(auVar106,auVar106));
      auVar106 = vshufpd_avx(auVar95,auVar95,1);
      auVar107 = vshufps_avx(auVar95,auVar95,0xaa);
      auVar173 = ZEXT3264(CONCAT1616(auVar107,auVar107));
      auVar107 = vshufps_avx(auVar83,auVar83,0);
      auVar181 = ZEXT3264(CONCAT1616(auVar107,auVar107));
      auVar107 = vshufps_avx(auVar83,auVar83,0x55);
      auVar97 = ZEXT3264(CONCAT1616(auVar107,auVar107));
      auVar107 = vshufps_avx(auVar83,auVar83,0xaa);
      auVar87 = ZEXT3264(CONCAT1616(auVar107,auVar107));
      uVar64 = (ulong)(auVar95._0_4_ < 0.0) << 5;
      uVar65 = (ulong)(auVar69._0_4_ < 0.0) << 5 | 0x40;
      uVar62 = (ulong)(auVar106._0_4_ < 0.0) << 5 | 0x80;
      uVar67 = uVar64 ^ 0x20;
      uVar68 = uVar65 ^ 0x20;
      auVar69 = vshufps_avx(auVar14,auVar14,0);
      auVar110 = ZEXT3264(CONCAT1616(auVar69,auVar69));
      auVar69 = vshufps_avx(ZEXT416((uint)fVar2),ZEXT416((uint)fVar2),0);
      auVar119._16_16_ = mm_lookupmask_ps._240_16_;
      auVar119._0_16_ = mm_lookupmask_ps._0_16_;
      auVar122 = ZEXT3264(auVar119);
      auVar184 = ZEXT3264(CONCAT1616(auVar69,auVar69));
      auVar72._8_4_ = 0x3f800000;
      auVar72._0_8_ = 0x3f8000003f800000;
      auVar72._12_4_ = 0x3f800000;
      auVar72._16_4_ = 0x3f800000;
      auVar72._20_4_ = 0x3f800000;
      auVar72._24_4_ = 0x3f800000;
      auVar72._28_4_ = 0x3f800000;
      auVar70._8_4_ = 0xbf800000;
      auVar70._0_8_ = 0xbf800000bf800000;
      auVar70._12_4_ = 0xbf800000;
      auVar70._16_4_ = 0xbf800000;
      auVar70._20_4_ = 0xbf800000;
      auVar70._24_4_ = 0xbf800000;
      auVar70._28_4_ = 0xbf800000;
      _local_1420 = vblendvps_avx(auVar72,auVar70,auVar119);
      do {
        uVar66 = puVar63[-1];
        puVar63 = puVar63 + -1;
        local_1480 = auVar129._0_32_;
        local_14a0 = auVar135._0_32_;
        local_14c0 = auVar146._0_32_;
        while ((uVar66 & 8) == 0) {
          auVar70 = vsubps_avx(*(undefined1 (*) [32])(uVar66 + 0x40 + uVar64),local_1480);
          auVar15._4_4_ = auVar161._4_4_ * auVar70._4_4_;
          auVar15._0_4_ = auVar161._0_4_ * auVar70._0_4_;
          auVar15._8_4_ = auVar161._8_4_ * auVar70._8_4_;
          auVar15._12_4_ = auVar161._12_4_ * auVar70._12_4_;
          auVar15._16_4_ = auVar161._16_4_ * auVar70._16_4_;
          auVar15._20_4_ = auVar161._20_4_ * auVar70._20_4_;
          auVar15._24_4_ = auVar161._24_4_ * auVar70._24_4_;
          auVar15._28_4_ = auVar70._28_4_;
          auVar70 = vsubps_avx(*(undefined1 (*) [32])(uVar66 + 0x40 + uVar65),local_14a0);
          auVar16._4_4_ = auVar164._4_4_ * auVar70._4_4_;
          auVar16._0_4_ = auVar164._0_4_ * auVar70._0_4_;
          auVar16._8_4_ = auVar164._8_4_ * auVar70._8_4_;
          auVar16._12_4_ = auVar164._12_4_ * auVar70._12_4_;
          auVar16._16_4_ = auVar164._16_4_ * auVar70._16_4_;
          auVar16._20_4_ = auVar164._20_4_ * auVar70._20_4_;
          auVar16._24_4_ = auVar164._24_4_ * auVar70._24_4_;
          auVar16._28_4_ = auVar70._28_4_;
          auVar70 = vmaxps_avx(auVar15,auVar16);
          auVar72 = vsubps_avx(*(undefined1 (*) [32])(uVar66 + 0x40 + uVar62),local_14c0);
          auVar17._4_4_ = auVar173._4_4_ * auVar72._4_4_;
          auVar17._0_4_ = auVar173._0_4_ * auVar72._0_4_;
          auVar17._8_4_ = auVar173._8_4_ * auVar72._8_4_;
          auVar17._12_4_ = auVar173._12_4_ * auVar72._12_4_;
          auVar17._16_4_ = auVar173._16_4_ * auVar72._16_4_;
          auVar17._20_4_ = auVar173._20_4_ * auVar72._20_4_;
          auVar17._24_4_ = auVar173._24_4_ * auVar72._24_4_;
          auVar17._28_4_ = auVar72._28_4_;
          auVar72 = vmaxps_avx(auVar17,auVar110._0_32_);
          auVar70 = vmaxps_avx(auVar70,auVar72);
          auVar72 = vsubps_avx(*(undefined1 (*) [32])(uVar66 + 0x40 + uVar67),local_1480);
          auVar18._4_4_ = auVar181._4_4_ * auVar72._4_4_;
          auVar18._0_4_ = auVar181._0_4_ * auVar72._0_4_;
          auVar18._8_4_ = auVar181._8_4_ * auVar72._8_4_;
          auVar18._12_4_ = auVar181._12_4_ * auVar72._12_4_;
          auVar18._16_4_ = auVar181._16_4_ * auVar72._16_4_;
          auVar18._20_4_ = auVar181._20_4_ * auVar72._20_4_;
          auVar18._24_4_ = auVar181._24_4_ * auVar72._24_4_;
          auVar18._28_4_ = auVar72._28_4_;
          auVar72 = vsubps_avx(*(undefined1 (*) [32])(uVar66 + 0x40 + uVar68),local_14a0);
          auVar19._4_4_ = auVar97._4_4_ * auVar72._4_4_;
          auVar19._0_4_ = auVar97._0_4_ * auVar72._0_4_;
          auVar19._8_4_ = auVar97._8_4_ * auVar72._8_4_;
          auVar19._12_4_ = auVar97._12_4_ * auVar72._12_4_;
          auVar19._16_4_ = auVar97._16_4_ * auVar72._16_4_;
          auVar19._20_4_ = auVar97._20_4_ * auVar72._20_4_;
          auVar19._24_4_ = auVar97._24_4_ * auVar72._24_4_;
          auVar19._28_4_ = auVar72._28_4_;
          auVar72 = vminps_avx(auVar18,auVar19);
          auVar119 = vsubps_avx(*(undefined1 (*) [32])(uVar66 + 0x40 + (uVar62 ^ 0x20)),local_14c0);
          auVar20._4_4_ = auVar87._4_4_ * auVar119._4_4_;
          auVar20._0_4_ = auVar87._0_4_ * auVar119._0_4_;
          auVar20._8_4_ = auVar87._8_4_ * auVar119._8_4_;
          auVar20._12_4_ = auVar87._12_4_ * auVar119._12_4_;
          auVar20._16_4_ = auVar87._16_4_ * auVar119._16_4_;
          auVar20._20_4_ = auVar87._20_4_ * auVar119._20_4_;
          auVar20._24_4_ = auVar87._24_4_ * auVar119._24_4_;
          auVar20._28_4_ = auVar119._28_4_;
          auVar119 = vminps_avx(auVar20,auVar184._0_32_);
          auVar72 = vminps_avx(auVar72,auVar119);
          auVar70 = vcmpps_avx(auVar70,auVar72,2);
          uVar58 = vmovmskps_avx(auVar70);
          if (uVar58 == 0) goto LAB_002eb4cd;
          uVar56 = uVar66 & 0xfffffffffffffff0;
          lVar61 = 0;
          if ((byte)uVar58 != 0) {
            for (; ((byte)uVar58 >> lVar61 & 1) == 0; lVar61 = lVar61 + 1) {
            }
          }
          uVar66 = *(ulong *)(uVar56 + lVar61 * 8);
          uVar58 = (uVar58 & 0xff) - 1 & uVar58 & 0xff;
          if (uVar58 != 0) {
            *puVar63 = uVar66;
            puVar63 = puVar63 + 1;
            lVar61 = 0;
            if (uVar58 != 0) {
              for (; (uVar58 >> lVar61 & 1) == 0; lVar61 = lVar61 + 1) {
              }
            }
            uVar66 = *(ulong *)(uVar56 + lVar61 * 8);
            uVar58 = uVar58 - 1 & uVar58;
            uVar59 = (ulong)uVar58;
            if (uVar58 != 0) {
              do {
                *puVar63 = uVar66;
                puVar63 = puVar63 + 1;
                lVar61 = 0;
                if (uVar59 != 0) {
                  for (; (uVar59 >> lVar61 & 1) == 0; lVar61 = lVar61 + 1) {
                  }
                }
                uVar66 = *(ulong *)(uVar56 + lVar61 * 8);
                uVar59 = uVar59 & uVar59 - 1;
              } while (uVar59 != 0);
            }
          }
        }
        local_17a8 = (ulong)((uint)uVar66 & 0xf) - 8;
        if (local_17a8 != 0) {
          uVar66 = uVar66 & 0xfffffffffffffff0;
          lVar61 = 0;
          local_14e0 = auVar161._0_32_;
          local_1500 = auVar164._0_32_;
          local_1520 = auVar173._0_32_;
          local_1540 = auVar181._0_32_;
          local_1560 = auVar97._0_32_;
          local_1580 = auVar87._0_32_;
          local_15a0 = auVar110._0_32_;
          local_15c0 = auVar122._0_32_;
          local_15e0 = auVar184._0_32_;
          do {
            lVar57 = lVar61 * 0xe0;
            lVar1 = uVar66 + 0xd0 + lVar57;
            local_1400 = *(undefined8 *)(lVar1 + 0x10);
            uStack_13f8 = *(undefined8 *)(lVar1 + 0x18);
            lVar1 = uVar66 + 0xc0 + lVar57;
            local_13e0 = *(undefined8 *)(lVar1 + 0x10);
            uStack_13d8 = *(undefined8 *)(lVar1 + 0x18);
            uStack_13d0 = local_13e0;
            uStack_13c8 = uStack_13d8;
            uStack_13f0 = local_1400;
            uStack_13e8 = uStack_13f8;
            auVar71._16_16_ = *(undefined1 (*) [16])(uVar66 + 0x60 + lVar57);
            auVar71._0_16_ = *(undefined1 (*) [16])(uVar66 + lVar57);
            auVar73._16_16_ = *(undefined1 (*) [16])(uVar66 + 0x70 + lVar57);
            auVar73._0_16_ = *(undefined1 (*) [16])(uVar66 + 0x10 + lVar57);
            auVar75._16_16_ = *(undefined1 (*) [16])(uVar66 + 0x80 + lVar57);
            auVar75._0_16_ = *(undefined1 (*) [16])(uVar66 + 0x20 + lVar57);
            auVar69 = *(undefined1 (*) [16])(uVar66 + 0x30 + lVar57);
            auVar96._16_16_ = auVar69;
            auVar96._0_16_ = auVar69;
            auVar69 = *(undefined1 (*) [16])(uVar66 + 0x40 + lVar57);
            auVar109._16_16_ = auVar69;
            auVar109._0_16_ = auVar69;
            auVar69 = *(undefined1 (*) [16])(uVar66 + 0x50 + lVar57);
            auVar183._16_16_ = auVar69;
            auVar183._0_16_ = auVar69;
            auVar69 = *(undefined1 (*) [16])(uVar66 + 0x90 + lVar57);
            auVar132._16_16_ = auVar69;
            auVar132._0_16_ = auVar69;
            auVar106 = *(undefined1 (*) [16])(uVar66 + 0xa0 + lVar57);
            auVar145._16_16_ = auVar106;
            auVar145._0_16_ = auVar106;
            auVar14 = *(undefined1 (*) [16])(uVar66 + 0xb0 + lVar57);
            auVar159._16_16_ = auVar14;
            auVar159._0_16_ = auVar14;
            uVar3 = *(undefined4 *)&(ray->org).field_0;
            auVar163._4_4_ = uVar3;
            auVar163._0_4_ = uVar3;
            auVar163._8_4_ = uVar3;
            auVar163._12_4_ = uVar3;
            auVar163._16_4_ = uVar3;
            auVar163._20_4_ = uVar3;
            auVar163._24_4_ = uVar3;
            auVar163._28_4_ = uVar3;
            uVar3 = *(undefined4 *)((long)&(ray->org).field_0 + 4);
            auVar172._4_4_ = uVar3;
            auVar172._0_4_ = uVar3;
            auVar172._8_4_ = uVar3;
            auVar172._12_4_ = uVar3;
            auVar172._16_4_ = uVar3;
            auVar172._20_4_ = uVar3;
            auVar172._24_4_ = uVar3;
            auVar172._28_4_ = uVar3;
            uVar3 = *(undefined4 *)((long)&(ray->org).field_0 + 8);
            auVar180._4_4_ = uVar3;
            auVar180._0_4_ = uVar3;
            auVar180._8_4_ = uVar3;
            auVar180._12_4_ = uVar3;
            auVar180._16_4_ = uVar3;
            auVar180._20_4_ = uVar3;
            auVar180._24_4_ = uVar3;
            auVar180._28_4_ = uVar3;
            local_1600 = vsubps_avx(auVar71,auVar163);
            local_16c0 = vsubps_avx(auVar73,auVar172);
            local_1620 = vsubps_avx(auVar75,auVar180);
            auVar70 = vsubps_avx(auVar96,auVar163);
            auVar72 = vsubps_avx(auVar109,auVar172);
            auVar119 = vsubps_avx(auVar183,auVar180);
            auVar15 = vsubps_avx(auVar132,auVar163);
            auVar16 = vsubps_avx(auVar145,auVar172);
            auVar17 = vsubps_avx(auVar159,auVar180);
            local_1640 = vsubps_avx(auVar15,local_1600);
            local_1660 = vsubps_avx(auVar16,local_16c0);
            local_1680 = vsubps_avx(auVar17,local_1620);
            fVar191 = local_16c0._0_4_;
            fVar94 = fVar191 + auVar16._0_4_;
            fVar193 = local_16c0._4_4_;
            fVar98 = fVar193 + auVar16._4_4_;
            fVar195 = local_16c0._8_4_;
            fVar99 = fVar195 + auVar16._8_4_;
            fVar197 = local_16c0._12_4_;
            fVar100 = fVar197 + auVar16._12_4_;
            fVar199 = local_16c0._16_4_;
            fVar101 = fVar199 + auVar16._16_4_;
            fVar201 = local_16c0._20_4_;
            fVar102 = fVar201 + auVar16._20_4_;
            fVar203 = local_16c0._24_4_;
            fVar103 = fVar203 + auVar16._24_4_;
            fVar82 = local_16c0._28_4_;
            fVar2 = local_1620._0_4_;
            fVar104 = auVar17._0_4_ + fVar2;
            fVar7 = local_1620._4_4_;
            fVar111 = auVar17._4_4_ + fVar7;
            fVar9 = local_1620._8_4_;
            fVar113 = auVar17._8_4_ + fVar9;
            fVar11 = local_1620._12_4_;
            fVar114 = auVar17._12_4_ + fVar11;
            fVar78 = local_1620._16_4_;
            fVar115 = auVar17._16_4_ + fVar78;
            fVar80 = local_1620._20_4_;
            fVar116 = auVar17._20_4_ + fVar80;
            fVar12 = local_1620._24_4_;
            fVar117 = auVar17._24_4_ + fVar12;
            fVar131 = local_1620._28_4_;
            fVar118 = local_1680._0_4_;
            fVar123 = local_1680._4_4_;
            auVar21._4_4_ = fVar123 * fVar98;
            auVar21._0_4_ = fVar118 * fVar94;
            fVar124 = local_1680._8_4_;
            auVar21._8_4_ = fVar124 * fVar99;
            fVar125 = local_1680._12_4_;
            auVar21._12_4_ = fVar125 * fVar100;
            fVar126 = local_1680._16_4_;
            auVar21._16_4_ = fVar126 * fVar101;
            fVar127 = local_1680._20_4_;
            auVar21._20_4_ = fVar127 * fVar102;
            fVar128 = local_1680._24_4_;
            auVar21._24_4_ = fVar128 * fVar103;
            auVar21._28_4_ = auVar69._12_4_;
            fVar171 = local_1660._0_4_;
            fVar174 = local_1660._4_4_;
            auVar22._4_4_ = fVar174 * fVar111;
            auVar22._0_4_ = fVar171 * fVar104;
            fVar175 = local_1660._8_4_;
            auVar22._8_4_ = fVar175 * fVar113;
            fVar176 = local_1660._12_4_;
            auVar22._12_4_ = fVar176 * fVar114;
            fVar177 = local_1660._16_4_;
            auVar22._16_4_ = fVar177 * fVar115;
            fVar178 = local_1660._20_4_;
            auVar22._20_4_ = fVar178 * fVar116;
            fVar179 = local_1660._24_4_;
            auVar22._24_4_ = fVar179 * fVar117;
            auVar22._28_4_ = auVar106._12_4_;
            auVar18 = vsubps_avx(auVar22,auVar21);
            fVar6 = local_1600._0_4_;
            fVar130 = auVar15._0_4_ + fVar6;
            fVar8 = local_1600._4_4_;
            fVar136 = auVar15._4_4_ + fVar8;
            fVar10 = local_1600._8_4_;
            fVar137 = auVar15._8_4_ + fVar10;
            fVar77 = local_1600._12_4_;
            fVar138 = auVar15._12_4_ + fVar77;
            fVar79 = local_1600._16_4_;
            fVar139 = auVar15._16_4_ + fVar79;
            fVar81 = local_1600._20_4_;
            fVar140 = auVar15._20_4_ + fVar81;
            fVar13 = local_1600._24_4_;
            fVar141 = auVar15._24_4_ + fVar13;
            fVar162 = local_1640._0_4_;
            fVar165 = local_1640._4_4_;
            auVar23._4_4_ = fVar165 * fVar111;
            auVar23._0_4_ = fVar162 * fVar104;
            fVar166 = local_1640._8_4_;
            auVar23._8_4_ = fVar166 * fVar113;
            fVar167 = local_1640._12_4_;
            auVar23._12_4_ = fVar167 * fVar114;
            fVar168 = local_1640._16_4_;
            auVar23._16_4_ = fVar168 * fVar115;
            fVar169 = local_1640._20_4_;
            auVar23._20_4_ = fVar169 * fVar116;
            fVar170 = local_1640._24_4_;
            auVar23._24_4_ = fVar170 * fVar117;
            auVar23._28_4_ = auVar17._28_4_ + fVar131;
            auVar21 = local_1680;
            auVar24._4_4_ = fVar136 * fVar123;
            auVar24._0_4_ = fVar130 * fVar118;
            auVar24._8_4_ = fVar137 * fVar124;
            auVar24._12_4_ = fVar138 * fVar125;
            auVar24._16_4_ = fVar139 * fVar126;
            auVar24._20_4_ = fVar140 * fVar127;
            auVar24._24_4_ = fVar141 * fVar128;
            auVar24._28_4_ = auVar14._12_4_;
            auVar19 = vsubps_avx(auVar24,auVar23);
            auVar25._4_4_ = fVar174 * fVar136;
            auVar25._0_4_ = fVar171 * fVar130;
            auVar25._8_4_ = fVar175 * fVar137;
            auVar25._12_4_ = fVar176 * fVar138;
            auVar25._16_4_ = fVar177 * fVar139;
            auVar25._20_4_ = fVar178 * fVar140;
            auVar25._24_4_ = fVar179 * fVar141;
            auVar25._28_4_ = auVar15._28_4_ + local_1600._28_4_;
            auVar26._4_4_ = fVar165 * fVar98;
            auVar26._0_4_ = fVar162 * fVar94;
            auVar26._8_4_ = fVar166 * fVar99;
            auVar26._12_4_ = fVar167 * fVar100;
            auVar26._16_4_ = fVar168 * fVar101;
            auVar26._20_4_ = fVar169 * fVar102;
            auVar26._24_4_ = fVar170 * fVar103;
            auVar26._28_4_ = fVar82 + auVar16._28_4_;
            auVar20 = vsubps_avx(auVar26,auVar25);
            local_16e0._4_4_ = (ray->dir).field_0.m128[1];
            local_1700._4_4_ = (ray->dir).field_0.m128[2];
            local_1780._4_4_ = (ray->dir).field_0.m128[0];
            local_17a0._0_4_ =
                 auVar18._0_4_ * local_1780._4_4_ +
                 local_16e0._4_4_ * auVar19._0_4_ + local_1700._4_4_ * auVar20._0_4_;
            local_17a0._4_4_ =
                 auVar18._4_4_ * local_1780._4_4_ +
                 local_16e0._4_4_ * auVar19._4_4_ + local_1700._4_4_ * auVar20._4_4_;
            local_17a0._8_4_ =
                 auVar18._8_4_ * local_1780._4_4_ +
                 local_16e0._4_4_ * auVar19._8_4_ + local_1700._4_4_ * auVar20._8_4_;
            local_17a0._12_4_ =
                 auVar18._12_4_ * local_1780._4_4_ +
                 local_16e0._4_4_ * auVar19._12_4_ + local_1700._4_4_ * auVar20._12_4_;
            local_17a0._16_4_ =
                 auVar18._16_4_ * local_1780._4_4_ +
                 local_16e0._4_4_ * auVar19._16_4_ + local_1700._4_4_ * auVar20._16_4_;
            local_17a0._20_4_ =
                 auVar18._20_4_ * local_1780._4_4_ +
                 local_16e0._4_4_ * auVar19._20_4_ + local_1700._4_4_ * auVar20._20_4_;
            local_17a0._24_4_ =
                 auVar18._24_4_ * local_1780._4_4_ +
                 local_16e0._4_4_ * auVar19._24_4_ + local_1700._4_4_ * auVar20._24_4_;
            local_17a0._28_4_ = auVar19._28_4_ + auVar19._28_4_ + auVar20._28_4_;
            local_16a0 = vsubps_avx(local_16c0,auVar72);
            auVar18 = vsubps_avx(local_1620,auVar119);
            fVar94 = fVar191 + auVar72._0_4_;
            fVar98 = fVar193 + auVar72._4_4_;
            fVar99 = fVar195 + auVar72._8_4_;
            fVar100 = fVar197 + auVar72._12_4_;
            fVar101 = fVar199 + auVar72._16_4_;
            fVar102 = fVar201 + auVar72._20_4_;
            fVar103 = fVar203 + auVar72._24_4_;
            fVar104 = auVar119._0_4_ + fVar2;
            fVar111 = auVar119._4_4_ + fVar7;
            fVar113 = auVar119._8_4_ + fVar9;
            fVar114 = auVar119._12_4_ + fVar11;
            fVar115 = auVar119._16_4_ + fVar78;
            fVar116 = auVar119._20_4_ + fVar80;
            fVar117 = auVar119._24_4_ + fVar12;
            fVar182 = auVar18._0_4_;
            fVar185 = auVar18._4_4_;
            auVar27._4_4_ = fVar185 * fVar98;
            auVar27._0_4_ = fVar182 * fVar94;
            fVar186 = auVar18._8_4_;
            auVar27._8_4_ = fVar186 * fVar99;
            fVar187 = auVar18._12_4_;
            auVar27._12_4_ = fVar187 * fVar100;
            fVar188 = auVar18._16_4_;
            auVar27._16_4_ = fVar188 * fVar101;
            fVar189 = auVar18._20_4_;
            auVar27._20_4_ = fVar189 * fVar102;
            fVar190 = auVar18._24_4_;
            auVar27._24_4_ = fVar190 * fVar103;
            auVar27._28_4_ = fVar82;
            fVar143 = local_16a0._0_4_;
            fVar147 = local_16a0._4_4_;
            auVar28._4_4_ = fVar147 * fVar111;
            auVar28._0_4_ = fVar143 * fVar104;
            fVar149 = local_16a0._8_4_;
            auVar28._8_4_ = fVar149 * fVar113;
            fVar151 = local_16a0._12_4_;
            auVar28._12_4_ = fVar151 * fVar114;
            fVar153 = local_16a0._16_4_;
            auVar28._16_4_ = fVar153 * fVar115;
            fVar155 = local_16a0._20_4_;
            auVar28._20_4_ = fVar155 * fVar116;
            fVar157 = local_16a0._24_4_;
            auVar28._24_4_ = fVar157 * fVar117;
            auVar28._28_4_ = fVar131;
            auVar18 = vsubps_avx(auVar28,auVar27);
            auVar19 = vsubps_avx(local_1600,auVar70);
            fVar192 = auVar19._0_4_;
            fVar194 = auVar19._4_4_;
            auVar29._4_4_ = fVar194 * fVar111;
            auVar29._0_4_ = fVar192 * fVar104;
            fVar196 = auVar19._8_4_;
            auVar29._8_4_ = fVar196 * fVar113;
            fVar198 = auVar19._12_4_;
            auVar29._12_4_ = fVar198 * fVar114;
            fVar200 = auVar19._16_4_;
            auVar29._16_4_ = fVar200 * fVar115;
            fVar202 = auVar19._20_4_;
            auVar29._20_4_ = fVar202 * fVar116;
            fVar204 = auVar19._24_4_;
            auVar29._24_4_ = fVar204 * fVar117;
            auVar29._28_4_ = auVar119._28_4_ + fVar131;
            fVar131 = auVar70._0_4_ + fVar6;
            fVar104 = auVar70._4_4_ + fVar8;
            fVar111 = auVar70._8_4_ + fVar10;
            fVar113 = auVar70._12_4_ + fVar77;
            fVar114 = auVar70._16_4_ + fVar79;
            fVar115 = auVar70._20_4_ + fVar81;
            fVar116 = auVar70._24_4_ + fVar13;
            fVar105 = auVar70._28_4_;
            fVar142 = fVar105 + local_1600._28_4_;
            auVar30._4_4_ = fVar185 * fVar104;
            auVar30._0_4_ = fVar182 * fVar131;
            auVar30._8_4_ = fVar186 * fVar111;
            auVar30._12_4_ = fVar187 * fVar113;
            auVar30._16_4_ = fVar188 * fVar114;
            auVar30._20_4_ = fVar189 * fVar115;
            auVar30._24_4_ = fVar190 * fVar116;
            auVar30._28_4_ = fVar105;
            auVar19 = vsubps_avx(auVar30,auVar29);
            auVar31._4_4_ = fVar147 * fVar104;
            auVar31._0_4_ = fVar143 * fVar131;
            auVar31._8_4_ = fVar149 * fVar111;
            auVar31._12_4_ = fVar151 * fVar113;
            auVar31._16_4_ = fVar153 * fVar114;
            auVar31._20_4_ = fVar155 * fVar115;
            auVar31._24_4_ = fVar157 * fVar116;
            auVar31._28_4_ = fVar142;
            auVar32._4_4_ = fVar194 * fVar98;
            auVar32._0_4_ = fVar192 * fVar94;
            auVar32._8_4_ = fVar196 * fVar99;
            auVar32._12_4_ = fVar198 * fVar100;
            auVar32._16_4_ = fVar200 * fVar101;
            auVar32._20_4_ = fVar202 * fVar102;
            auVar32._24_4_ = fVar204 * fVar103;
            auVar32._28_4_ = fVar82 + auVar72._28_4_;
            auVar20 = vsubps_avx(auVar32,auVar31);
            local_1440._0_4_ =
                 local_1780._4_4_ * auVar18._0_4_ +
                 local_16e0._4_4_ * auVar19._0_4_ + local_1700._4_4_ * auVar20._0_4_;
            local_1440._4_4_ =
                 local_1780._4_4_ * auVar18._4_4_ +
                 local_16e0._4_4_ * auVar19._4_4_ + local_1700._4_4_ * auVar20._4_4_;
            local_1440._8_4_ =
                 local_1780._4_4_ * auVar18._8_4_ +
                 local_16e0._4_4_ * auVar19._8_4_ + local_1700._4_4_ * auVar20._8_4_;
            local_1440._12_4_ =
                 local_1780._4_4_ * auVar18._12_4_ +
                 local_16e0._4_4_ * auVar19._12_4_ + local_1700._4_4_ * auVar20._12_4_;
            local_1440._16_4_ =
                 local_1780._4_4_ * auVar18._16_4_ +
                 local_16e0._4_4_ * auVar19._16_4_ + local_1700._4_4_ * auVar20._16_4_;
            local_1440._20_4_ =
                 local_1780._4_4_ * auVar18._20_4_ +
                 local_16e0._4_4_ * auVar19._20_4_ + local_1700._4_4_ * auVar20._20_4_;
            local_1440._24_4_ =
                 local_1780._4_4_ * auVar18._24_4_ +
                 local_16e0._4_4_ * auVar19._24_4_ + local_1700._4_4_ * auVar20._24_4_;
            local_1440._28_4_ = auVar18._28_4_ + auVar19._28_4_ + auVar20._28_4_;
            auVar18 = vsubps_avx(auVar70,auVar15);
            fVar117 = auVar70._0_4_ + auVar15._0_4_;
            fVar130 = auVar70._4_4_ + auVar15._4_4_;
            fVar136 = auVar70._8_4_ + auVar15._8_4_;
            fVar137 = auVar70._12_4_ + auVar15._12_4_;
            fVar138 = auVar70._16_4_ + auVar15._16_4_;
            fVar139 = auVar70._20_4_ + auVar15._20_4_;
            fVar140 = auVar70._24_4_ + auVar15._24_4_;
            fVar141 = fVar105 + auVar15._28_4_;
            auVar15 = vsubps_avx(auVar72,auVar16);
            fVar103 = auVar72._0_4_ + auVar16._0_4_;
            fVar104 = auVar72._4_4_ + auVar16._4_4_;
            fVar111 = auVar72._8_4_ + auVar16._8_4_;
            fVar113 = auVar72._12_4_ + auVar16._12_4_;
            fVar114 = auVar72._16_4_ + auVar16._16_4_;
            fVar115 = auVar72._20_4_ + auVar16._20_4_;
            fVar116 = auVar72._24_4_ + auVar16._24_4_;
            auVar70 = vsubps_avx(auVar119,auVar17);
            fVar82 = auVar119._0_4_ + auVar17._0_4_;
            fVar88 = auVar119._4_4_ + auVar17._4_4_;
            fVar89 = auVar119._8_4_ + auVar17._8_4_;
            fVar90 = auVar119._12_4_ + auVar17._12_4_;
            fVar91 = auVar119._16_4_ + auVar17._16_4_;
            fVar92 = auVar119._20_4_ + auVar17._20_4_;
            fVar93 = auVar119._24_4_ + auVar17._24_4_;
            fVar131 = auVar70._0_4_;
            fVar94 = auVar70._4_4_;
            auVar33._4_4_ = fVar94 * fVar104;
            auVar33._0_4_ = fVar131 * fVar103;
            fVar98 = auVar70._8_4_;
            auVar33._8_4_ = fVar98 * fVar111;
            fVar99 = auVar70._12_4_;
            auVar33._12_4_ = fVar99 * fVar113;
            fVar100 = auVar70._16_4_;
            auVar33._16_4_ = fVar100 * fVar114;
            fVar101 = auVar70._20_4_;
            auVar33._20_4_ = fVar101 * fVar115;
            fVar102 = auVar70._24_4_;
            auVar33._24_4_ = fVar102 * fVar116;
            auVar33._28_4_ = fVar105;
            fVar144 = auVar15._0_4_;
            fVar148 = auVar15._4_4_;
            auVar34._4_4_ = fVar148 * fVar88;
            auVar34._0_4_ = fVar144 * fVar82;
            fVar150 = auVar15._8_4_;
            auVar34._8_4_ = fVar150 * fVar89;
            fVar152 = auVar15._12_4_;
            auVar34._12_4_ = fVar152 * fVar90;
            fVar154 = auVar15._16_4_;
            auVar34._16_4_ = fVar154 * fVar91;
            fVar156 = auVar15._20_4_;
            auVar34._20_4_ = fVar156 * fVar92;
            fVar158 = auVar15._24_4_;
            auVar34._24_4_ = fVar158 * fVar93;
            auVar34._28_4_ = fVar142;
            auVar19 = vsubps_avx(auVar34,auVar33);
            fVar105 = auVar18._0_4_;
            fVar112 = auVar18._4_4_;
            auVar35._4_4_ = fVar112 * fVar88;
            auVar35._0_4_ = fVar105 * fVar82;
            fVar82 = auVar18._8_4_;
            auVar35._8_4_ = fVar82 * fVar89;
            fVar88 = auVar18._12_4_;
            auVar35._12_4_ = fVar88 * fVar90;
            fVar89 = auVar18._16_4_;
            auVar35._16_4_ = fVar89 * fVar91;
            fVar90 = auVar18._20_4_;
            auVar35._20_4_ = fVar90 * fVar92;
            fVar91 = auVar18._24_4_;
            auVar35._24_4_ = fVar91 * fVar93;
            auVar35._28_4_ = auVar119._28_4_ + auVar17._28_4_;
            auVar36._4_4_ = fVar94 * fVar130;
            auVar36._0_4_ = fVar131 * fVar117;
            auVar36._8_4_ = fVar98 * fVar136;
            auVar36._12_4_ = fVar99 * fVar137;
            auVar36._16_4_ = fVar100 * fVar138;
            auVar36._20_4_ = fVar101 * fVar139;
            auVar36._24_4_ = fVar102 * fVar140;
            auVar36._28_4_ = fVar142;
            auVar70 = vsubps_avx(auVar36,auVar35);
            auVar37._4_4_ = fVar148 * fVar130;
            auVar37._0_4_ = fVar144 * fVar117;
            auVar37._8_4_ = fVar150 * fVar136;
            auVar37._12_4_ = fVar152 * fVar137;
            auVar37._16_4_ = fVar154 * fVar138;
            auVar37._20_4_ = fVar156 * fVar139;
            auVar37._24_4_ = fVar158 * fVar140;
            auVar37._28_4_ = fVar141;
            auVar38._4_4_ = fVar112 * fVar104;
            auVar38._0_4_ = fVar105 * fVar103;
            auVar38._8_4_ = fVar82 * fVar111;
            auVar38._12_4_ = fVar88 * fVar113;
            auVar38._16_4_ = fVar89 * fVar114;
            auVar38._20_4_ = fVar90 * fVar115;
            auVar38._24_4_ = fVar91 * fVar116;
            auVar38._28_4_ = auVar72._28_4_ + auVar16._28_4_;
            auVar72 = vsubps_avx(auVar38,auVar37);
            local_1700._0_4_ = local_1700._4_4_;
            fStack_16f8 = local_1700._4_4_;
            fStack_16f4 = local_1700._4_4_;
            fStack_16f0 = local_1700._4_4_;
            fStack_16ec = local_1700._4_4_;
            fStack_16e8 = local_1700._4_4_;
            fStack_16e4 = local_1700._4_4_;
            local_16e0._0_4_ = local_16e0._4_4_;
            fStack_16d8 = local_16e0._4_4_;
            fStack_16d4 = local_16e0._4_4_;
            fStack_16d0 = local_16e0._4_4_;
            fStack_16cc = local_16e0._4_4_;
            fStack_16c8 = local_16e0._4_4_;
            fStack_16c4 = local_16e0._4_4_;
            local_1780._0_4_ = local_1780._4_4_;
            fStack_1778 = local_1780._4_4_;
            fStack_1774 = local_1780._4_4_;
            fStack_1770 = local_1780._4_4_;
            fStack_176c = local_1780._4_4_;
            fStack_1768 = local_1780._4_4_;
            fStack_1764 = local_1780._4_4_;
            auVar74._0_4_ =
                 auVar19._0_4_ * local_1780._4_4_ +
                 local_16e0._4_4_ * auVar70._0_4_ + local_1700._4_4_ * auVar72._0_4_;
            auVar74._4_4_ =
                 auVar19._4_4_ * local_1780._4_4_ +
                 local_16e0._4_4_ * auVar70._4_4_ + local_1700._4_4_ * auVar72._4_4_;
            auVar74._8_4_ =
                 auVar19._8_4_ * local_1780._4_4_ +
                 local_16e0._4_4_ * auVar70._8_4_ + local_1700._4_4_ * auVar72._8_4_;
            auVar74._12_4_ =
                 auVar19._12_4_ * local_1780._4_4_ +
                 local_16e0._4_4_ * auVar70._12_4_ + local_1700._4_4_ * auVar72._12_4_;
            auVar74._16_4_ =
                 auVar19._16_4_ * local_1780._4_4_ +
                 local_16e0._4_4_ * auVar70._16_4_ + local_1700._4_4_ * auVar72._16_4_;
            auVar74._20_4_ =
                 auVar19._20_4_ * local_1780._4_4_ +
                 local_16e0._4_4_ * auVar70._20_4_ + local_1700._4_4_ * auVar72._20_4_;
            auVar74._24_4_ =
                 auVar19._24_4_ * local_1780._4_4_ +
                 local_16e0._4_4_ * auVar70._24_4_ + local_1700._4_4_ * auVar72._24_4_;
            auVar74._28_4_ = fVar141 + fVar141 + auVar72._28_4_;
            local_1380._0_4_ = auVar74._0_4_ + local_17a0._0_4_ + local_1440._0_4_;
            local_1380._4_4_ = auVar74._4_4_ + local_17a0._4_4_ + local_1440._4_4_;
            local_1380._8_4_ = auVar74._8_4_ + local_17a0._8_4_ + local_1440._8_4_;
            local_1380._12_4_ = auVar74._12_4_ + local_17a0._12_4_ + local_1440._12_4_;
            local_1380._16_4_ = auVar74._16_4_ + local_17a0._16_4_ + local_1440._16_4_;
            local_1380._20_4_ = auVar74._20_4_ + local_17a0._20_4_ + local_1440._20_4_;
            local_1380._24_4_ = auVar74._24_4_ + local_17a0._24_4_ + local_1440._24_4_;
            local_1380._28_4_ = auVar74._28_4_ + local_17a0._28_4_ + local_1440._28_4_;
            auVar70 = vminps_avx(local_17a0,local_1440);
            auVar70 = vminps_avx(auVar70,auVar74);
            auVar84._8_4_ = 0x7fffffff;
            auVar84._0_8_ = 0x7fffffff7fffffff;
            auVar84._12_4_ = 0x7fffffff;
            auVar84._16_4_ = 0x7fffffff;
            auVar84._20_4_ = 0x7fffffff;
            auVar84._24_4_ = 0x7fffffff;
            auVar84._28_4_ = 0x7fffffff;
            local_1460 = vandps_avx(local_1380,auVar84);
            fVar103 = local_1460._0_4_ * 1.1920929e-07;
            fVar104 = local_1460._4_4_ * 1.1920929e-07;
            auVar39._4_4_ = fVar104;
            auVar39._0_4_ = fVar103;
            fVar111 = local_1460._8_4_ * 1.1920929e-07;
            auVar39._8_4_ = fVar111;
            fVar113 = local_1460._12_4_ * 1.1920929e-07;
            auVar39._12_4_ = fVar113;
            fVar114 = local_1460._16_4_ * 1.1920929e-07;
            auVar39._16_4_ = fVar114;
            fVar115 = local_1460._20_4_ * 1.1920929e-07;
            auVar39._20_4_ = fVar115;
            fVar116 = local_1460._24_4_ * 1.1920929e-07;
            auVar39._24_4_ = fVar116;
            auVar39._28_4_ = 0x34000000;
            auVar133._0_8_ = CONCAT44(fVar104,fVar103) ^ 0x8000000080000000;
            auVar133._8_4_ = -fVar111;
            auVar133._12_4_ = -fVar113;
            auVar133._16_4_ = -fVar114;
            auVar133._20_4_ = -fVar115;
            auVar133._24_4_ = -fVar116;
            auVar133._28_4_ = 0xb4000000;
            auVar70 = vcmpps_avx(auVar70,auVar133,5);
            auVar119 = vmaxps_avx(local_17a0,local_1440);
            auVar72 = vmaxps_avx(auVar119,auVar74);
            auVar72 = vcmpps_avx(auVar72,auVar39,2);
            auVar72 = vorps_avx(auVar70,auVar72);
            if ((((((((auVar72 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar72 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar72 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar72 >> 0x7f,0) == '\0') &&
                  (auVar72 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar72 >> 0xbf,0) == '\0') &&
                (auVar72 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar72[0x1f]) {
LAB_002eb450:
              auVar129 = ZEXT3264(local_1480);
              auVar135 = ZEXT3264(local_14a0);
              auVar146 = ZEXT3264(local_14c0);
              auVar161 = ZEXT3264(local_14e0);
              auVar164 = ZEXT3264(local_1500);
              auVar173 = ZEXT3264(local_1520);
              auVar181 = ZEXT3264(local_1540);
              auVar97 = ZEXT3264(local_1560);
              auVar87 = ZEXT3264(local_1580);
              auVar110 = ZEXT3264(local_15a0);
              auVar122 = ZEXT3264(local_15c0);
              auVar184 = ZEXT3264(local_15e0);
            }
            else {
              auVar40._4_4_ = fVar147 * fVar123;
              auVar40._0_4_ = fVar143 * fVar118;
              auVar40._8_4_ = fVar149 * fVar124;
              auVar40._12_4_ = fVar151 * fVar125;
              auVar40._16_4_ = fVar153 * fVar126;
              auVar40._20_4_ = fVar155 * fVar127;
              auVar40._24_4_ = fVar157 * fVar128;
              auVar40._28_4_ = auVar70._28_4_;
              auVar41._4_4_ = fVar185 * fVar174;
              auVar41._0_4_ = fVar182 * fVar171;
              auVar41._8_4_ = fVar186 * fVar175;
              auVar41._12_4_ = fVar187 * fVar176;
              auVar41._16_4_ = fVar188 * fVar177;
              auVar41._20_4_ = fVar189 * fVar178;
              auVar41._24_4_ = fVar190 * fVar179;
              auVar41._28_4_ = 0x34000000;
              auVar16 = vsubps_avx(auVar41,auVar40);
              auVar42._4_4_ = fVar185 * fVar148;
              auVar42._0_4_ = fVar182 * fVar144;
              auVar42._8_4_ = fVar186 * fVar150;
              auVar42._12_4_ = fVar187 * fVar152;
              auVar42._16_4_ = fVar188 * fVar154;
              auVar42._20_4_ = fVar189 * fVar156;
              auVar42._24_4_ = fVar190 * fVar158;
              auVar42._28_4_ = auVar119._28_4_;
              auVar43._4_4_ = fVar147 * fVar94;
              auVar43._0_4_ = fVar143 * fVar131;
              auVar43._8_4_ = fVar149 * fVar98;
              auVar43._12_4_ = fVar151 * fVar99;
              auVar43._16_4_ = fVar153 * fVar100;
              auVar43._20_4_ = fVar155 * fVar101;
              auVar43._24_4_ = fVar157 * fVar102;
              auVar43._28_4_ = auVar19._28_4_;
              auVar17 = vsubps_avx(auVar43,auVar42);
              auVar160._8_4_ = 0x7fffffff;
              auVar160._0_8_ = 0x7fffffff7fffffff;
              auVar160._12_4_ = 0x7fffffff;
              auVar160._16_4_ = 0x7fffffff;
              auVar160._20_4_ = 0x7fffffff;
              auVar160._24_4_ = 0x7fffffff;
              auVar160._28_4_ = 0x7fffffff;
              auVar70 = vandps_avx(auVar160,auVar40);
              auVar119 = vandps_avx(auVar42,auVar160);
              auVar70 = vcmpps_avx(auVar70,auVar119,1);
              local_1360 = vblendvps_avx(auVar17,auVar16,auVar70);
              auVar44._4_4_ = fVar194 * fVar94;
              auVar44._0_4_ = fVar192 * fVar131;
              auVar44._8_4_ = fVar196 * fVar98;
              auVar44._12_4_ = fVar198 * fVar99;
              auVar44._16_4_ = fVar200 * fVar100;
              auVar44._20_4_ = fVar202 * fVar101;
              auVar44._24_4_ = fVar204 * fVar102;
              auVar44._28_4_ = auVar70._28_4_;
              auVar45._4_4_ = fVar194 * fVar123;
              auVar45._0_4_ = fVar192 * fVar118;
              auVar45._8_4_ = fVar196 * fVar124;
              auVar45._12_4_ = fVar198 * fVar125;
              auVar45._16_4_ = fVar200 * fVar126;
              auVar45._20_4_ = fVar202 * fVar127;
              auVar45._24_4_ = fVar204 * fVar128;
              auVar45._28_4_ = auVar16._28_4_;
              auVar46._4_4_ = fVar165 * fVar185;
              auVar46._0_4_ = fVar162 * fVar182;
              auVar46._8_4_ = fVar166 * fVar186;
              auVar46._12_4_ = fVar167 * fVar187;
              auVar46._16_4_ = fVar168 * fVar188;
              auVar46._20_4_ = fVar169 * fVar189;
              auVar46._24_4_ = fVar170 * fVar190;
              auVar46._28_4_ = local_1680._28_4_;
              auVar16 = vsubps_avx(auVar45,auVar46);
              auVar47._4_4_ = fVar185 * fVar112;
              auVar47._0_4_ = fVar182 * fVar105;
              auVar47._8_4_ = fVar186 * fVar82;
              auVar47._12_4_ = fVar187 * fVar88;
              auVar47._16_4_ = fVar188 * fVar89;
              auVar47._20_4_ = fVar189 * fVar90;
              auVar47._24_4_ = fVar190 * fVar91;
              auVar47._28_4_ = auVar119._28_4_;
              auVar17 = vsubps_avx(auVar47,auVar44);
              auVar70 = vandps_avx(auVar160,auVar46);
              auVar119 = vandps_avx(auVar160,auVar44);
              auVar70 = vcmpps_avx(auVar70,auVar119,1);
              local_1340 = vblendvps_avx(auVar17,auVar16,auVar70);
              auVar134._8_4_ = 0x3f800000;
              auVar134._0_8_ = 0x3f8000003f800000;
              auVar134._12_4_ = 0x3f800000;
              auVar134._16_4_ = 0x3f800000;
              auVar134._20_4_ = 0x3f800000;
              auVar134._24_4_ = 0x3f800000;
              auVar134._28_4_ = 0x3f800000;
              auVar48._4_4_ = fVar147 * fVar112;
              auVar48._0_4_ = fVar143 * fVar105;
              auVar48._8_4_ = fVar149 * fVar82;
              auVar48._12_4_ = fVar151 * fVar88;
              auVar48._16_4_ = fVar153 * fVar89;
              auVar48._20_4_ = fVar155 * fVar90;
              auVar48._24_4_ = fVar157 * fVar91;
              auVar48._28_4_ = auVar70._28_4_;
              auVar49._4_4_ = fVar165 * fVar147;
              auVar49._0_4_ = fVar162 * fVar143;
              auVar49._8_4_ = fVar166 * fVar149;
              auVar49._12_4_ = fVar167 * fVar151;
              auVar49._16_4_ = fVar168 * fVar153;
              auVar49._20_4_ = fVar169 * fVar155;
              auVar49._24_4_ = fVar170 * fVar157;
              auVar49._28_4_ = auVar16._28_4_;
              auVar50._4_4_ = fVar194 * fVar174;
              auVar50._0_4_ = fVar192 * fVar171;
              auVar50._8_4_ = fVar196 * fVar175;
              auVar50._12_4_ = fVar198 * fVar176;
              auVar50._16_4_ = fVar200 * fVar177;
              auVar50._20_4_ = fVar202 * fVar178;
              auVar50._24_4_ = fVar204 * fVar179;
              auVar50._28_4_ = auVar18._28_4_;
              auVar51._4_4_ = fVar194 * fVar148;
              auVar51._0_4_ = fVar192 * fVar144;
              auVar51._8_4_ = fVar196 * fVar150;
              auVar51._12_4_ = fVar198 * fVar152;
              auVar51._16_4_ = fVar200 * fVar154;
              auVar51._20_4_ = fVar202 * fVar156;
              auVar51._24_4_ = fVar204 * fVar158;
              auVar51._28_4_ = auVar15._28_4_;
              auVar15 = vsubps_avx(auVar49,auVar50);
              auVar16 = vsubps_avx(auVar51,auVar48);
              auVar70 = vandps_avx(auVar160,auVar50);
              auVar119 = vandps_avx(auVar160,auVar48);
              auVar119 = vcmpps_avx(auVar70,auVar119,1);
              local_1320 = vblendvps_avx(auVar16,auVar15,auVar119);
              auVar69 = vpackssdw_avx(auVar72._0_16_,auVar72._16_16_);
              fVar94 = local_1320._0_4_;
              fVar98 = local_1320._4_4_;
              fVar99 = local_1320._8_4_;
              fVar100 = local_1320._12_4_;
              fVar101 = local_1320._16_4_;
              fVar102 = local_1320._20_4_;
              fVar103 = local_1320._24_4_;
              fVar130 = local_1340._0_4_;
              fVar136 = local_1340._4_4_;
              fVar137 = local_1340._8_4_;
              fVar138 = local_1340._12_4_;
              fVar139 = local_1340._16_4_;
              fVar140 = local_1340._20_4_;
              fVar141 = local_1340._24_4_;
              fVar82 = local_1360._0_4_;
              fVar88 = local_1360._4_4_;
              fVar89 = local_1360._8_4_;
              fVar90 = local_1360._12_4_;
              fVar91 = local_1360._16_4_;
              fVar92 = local_1360._20_4_;
              fVar93 = local_1360._24_4_;
              fVar131 = fVar82 * local_1780._4_4_ +
                        fVar130 * local_16e0._4_4_ + fVar94 * local_1700._4_4_;
              fVar104 = fVar88 * local_1780._4_4_ +
                        fVar136 * local_16e0._4_4_ + fVar98 * local_1700._4_4_;
              fVar111 = fVar89 * local_1780._4_4_ +
                        fVar137 * local_16e0._4_4_ + fVar99 * local_1700._4_4_;
              fVar113 = fVar90 * local_1780._4_4_ +
                        fVar138 * local_16e0._4_4_ + fVar100 * local_1700._4_4_;
              fVar114 = fVar91 * local_1780._4_4_ +
                        fVar139 * local_16e0._4_4_ + fVar101 * local_1700._4_4_;
              fVar115 = fVar92 * local_1780._4_4_ +
                        fVar140 * local_16e0._4_4_ + fVar102 * local_1700._4_4_;
              fVar116 = fVar93 * local_1780._4_4_ +
                        fVar141 * local_16e0._4_4_ + fVar103 * local_1700._4_4_;
              fVar117 = auVar15._28_4_ + auVar15._28_4_ + 0.0;
              auVar85._0_4_ = fVar131 + fVar131;
              auVar85._4_4_ = fVar104 + fVar104;
              auVar85._8_4_ = fVar111 + fVar111;
              auVar85._12_4_ = fVar113 + fVar113;
              auVar85._16_4_ = fVar114 + fVar114;
              auVar85._20_4_ = fVar115 + fVar115;
              auVar85._24_4_ = fVar116 + fVar116;
              auVar85._28_4_ = fVar117 + fVar117;
              fVar131 = auVar70._28_4_;
              auVar70 = vrcpps_avx(auVar85);
              fVar104 = fVar82 * fVar6 + fVar130 * fVar191 + fVar94 * fVar2;
              fVar111 = fVar88 * fVar8 + fVar136 * fVar193 + fVar98 * fVar7;
              fVar113 = fVar89 * fVar10 + fVar137 * fVar195 + fVar99 * fVar9;
              fVar77 = fVar90 * fVar77 + fVar138 * fVar197 + fVar100 * fVar11;
              fVar78 = fVar91 * fVar79 + fVar139 * fVar199 + fVar101 * fVar78;
              fVar79 = fVar92 * fVar81 + fVar140 * fVar201 + fVar102 * fVar80;
              fVar80 = fVar93 * fVar13 + fVar141 * fVar203 + fVar103 * fVar12;
              fVar81 = fVar131 + fVar131 + fVar117;
              fVar2 = auVar70._0_4_;
              fVar6 = auVar70._4_4_;
              auVar52._4_4_ = auVar85._4_4_ * fVar6;
              auVar52._0_4_ = auVar85._0_4_ * fVar2;
              fVar7 = auVar70._8_4_;
              auVar52._8_4_ = auVar85._8_4_ * fVar7;
              fVar8 = auVar70._12_4_;
              auVar52._12_4_ = auVar85._12_4_ * fVar8;
              fVar9 = auVar70._16_4_;
              auVar52._16_4_ = auVar85._16_4_ * fVar9;
              fVar10 = auVar70._20_4_;
              auVar52._20_4_ = auVar85._20_4_ * fVar10;
              fVar11 = auVar70._24_4_;
              auVar52._24_4_ = auVar85._24_4_ * fVar11;
              auVar52._28_4_ = fVar131;
              auVar70 = vsubps_avx(auVar134,auVar52);
              uVar3 = *(undefined4 *)((long)&(ray->org).field_0 + 0xc);
              auVar120._4_4_ = uVar3;
              auVar120._0_4_ = uVar3;
              auVar120._8_4_ = uVar3;
              auVar120._12_4_ = uVar3;
              auVar120._16_4_ = uVar3;
              auVar120._20_4_ = uVar3;
              auVar120._24_4_ = uVar3;
              auVar120._28_4_ = uVar3;
              local_12a0._4_4_ = (fVar111 + fVar111) * (fVar6 + fVar6 * auVar70._4_4_);
              local_12a0._0_4_ = (fVar104 + fVar104) * (fVar2 + fVar2 * auVar70._0_4_);
              local_12a0._8_4_ = (fVar113 + fVar113) * (fVar7 + fVar7 * auVar70._8_4_);
              local_12a0._12_4_ = (fVar77 + fVar77) * (fVar8 + fVar8 * auVar70._12_4_);
              local_12a0._16_4_ = (fVar78 + fVar78) * (fVar9 + fVar9 * auVar70._16_4_);
              local_12a0._20_4_ = (fVar79 + fVar79) * (fVar10 + fVar10 * auVar70._20_4_);
              local_12a0._24_4_ = (fVar80 + fVar80) * (fVar11 + fVar11 * auVar70._24_4_);
              local_12a0._28_4_ = fVar81 + fVar81;
              auVar70 = vcmpps_avx(auVar120,local_12a0,2);
              fVar2 = ray->tfar;
              auVar121._4_4_ = fVar2;
              auVar121._0_4_ = fVar2;
              auVar121._8_4_ = fVar2;
              auVar121._12_4_ = fVar2;
              auVar121._16_4_ = fVar2;
              auVar121._20_4_ = fVar2;
              auVar121._24_4_ = fVar2;
              auVar121._28_4_ = fVar2;
              auVar72 = vcmpps_avx(local_12a0,auVar121,2);
              auVar70 = vandps_avx(auVar72,auVar70);
              auVar72 = vcmpps_avx(auVar85,_DAT_01faff00,4);
              auVar70 = vandps_avx(auVar70,auVar72);
              auVar106 = vpackssdw_avx(auVar70._0_16_,auVar70._16_16_);
              auVar69 = vpand_avx(auVar106,auVar69);
              auVar106 = vpmovsxwd_avx(auVar69);
              auVar14 = vpshufd_avx(auVar69,0xee);
              auVar14 = vpmovsxwd_avx(auVar14);
              local_1300._16_16_ = auVar14;
              local_1300._0_16_ = auVar106;
              if ((((((((local_1300 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                       (local_1300 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (local_1300 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(local_1300 >> 0x7f,0) == '\0') &&
                    (local_1300 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   SUB161(auVar14 >> 0x3f,0) == '\0') &&
                  (local_1300 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  -1 < auVar14[0xf]) goto LAB_002eb450;
              local_1600._0_8_ = lVar61;
              local_13c0 = local_17a0._0_4_;
              fStack_13bc = local_17a0._4_4_;
              fStack_13b8 = local_17a0._8_4_;
              fStack_13b4 = local_17a0._12_4_;
              fStack_13b0 = local_17a0._16_4_;
              fStack_13ac = local_17a0._20_4_;
              fStack_13a8 = local_17a0._24_4_;
              fStack_13a4 = local_17a0._28_4_;
              local_13a0 = local_1440._0_4_;
              fStack_139c = local_1440._4_4_;
              fStack_1398 = local_1440._8_4_;
              fStack_1394 = local_1440._12_4_;
              fStack_1390 = local_1440._16_4_;
              fStack_138c = local_1440._20_4_;
              fStack_1388 = local_1440._24_4_;
              fStack_1384 = local_1440._28_4_;
              auVar122 = ZEXT3264(local_15c0);
              local_1220 = local_15c0;
              auVar70 = vrcpps_avx(local_1380);
              fVar2 = auVar70._0_4_;
              fVar6 = auVar70._4_4_;
              auVar53._4_4_ = local_1380._4_4_ * fVar6;
              auVar53._0_4_ = local_1380._0_4_ * fVar2;
              fVar7 = auVar70._8_4_;
              auVar53._8_4_ = local_1380._8_4_ * fVar7;
              fVar8 = auVar70._12_4_;
              auVar53._12_4_ = local_1380._12_4_ * fVar8;
              fVar9 = auVar70._16_4_;
              auVar53._16_4_ = local_1380._16_4_ * fVar9;
              fVar10 = auVar70._20_4_;
              auVar53._20_4_ = local_1380._20_4_ * fVar10;
              fVar11 = auVar70._24_4_;
              auVar53._24_4_ = local_1380._24_4_ * fVar11;
              auVar53._28_4_ = auVar14._12_4_;
              auVar72 = vsubps_avx(auVar134,auVar53);
              auVar76._0_4_ = fVar2 + fVar2 * auVar72._0_4_;
              auVar76._4_4_ = fVar6 + fVar6 * auVar72._4_4_;
              auVar76._8_4_ = fVar7 + fVar7 * auVar72._8_4_;
              auVar76._12_4_ = fVar8 + fVar8 * auVar72._12_4_;
              auVar76._16_4_ = fVar9 + fVar9 * auVar72._16_4_;
              auVar76._20_4_ = fVar10 + fVar10 * auVar72._20_4_;
              auVar76._24_4_ = fVar11 + fVar11 * auVar72._24_4_;
              auVar76._28_4_ = auVar70._28_4_ + auVar72._28_4_;
              auVar86._8_4_ = 0x219392ef;
              auVar86._0_8_ = 0x219392ef219392ef;
              auVar86._12_4_ = 0x219392ef;
              auVar86._16_4_ = 0x219392ef;
              auVar86._20_4_ = 0x219392ef;
              auVar86._24_4_ = 0x219392ef;
              auVar86._28_4_ = 0x219392ef;
              auVar72 = vcmpps_avx(local_1460,auVar86,5);
              auVar70 = vandps_avx(auVar72,auVar76);
              auVar54._4_4_ = local_17a0._4_4_ * auVar70._4_4_;
              auVar54._0_4_ = local_17a0._0_4_ * auVar70._0_4_;
              auVar54._8_4_ = local_17a0._8_4_ * auVar70._8_4_;
              auVar54._12_4_ = local_17a0._12_4_ * auVar70._12_4_;
              auVar54._16_4_ = local_17a0._16_4_ * auVar70._16_4_;
              auVar54._20_4_ = local_17a0._20_4_ * auVar70._20_4_;
              auVar54._24_4_ = local_17a0._24_4_ * auVar70._24_4_;
              auVar54._28_4_ = auVar72._28_4_;
              auVar72 = vminps_avx(auVar54,auVar134);
              auVar55._4_4_ = local_1440._4_4_ * auVar70._4_4_;
              auVar55._0_4_ = local_1440._0_4_ * auVar70._0_4_;
              auVar55._8_4_ = local_1440._8_4_ * auVar70._8_4_;
              auVar55._12_4_ = local_1440._12_4_ * auVar70._12_4_;
              auVar55._16_4_ = local_1440._16_4_ * auVar70._16_4_;
              auVar55._20_4_ = local_1440._20_4_ * auVar70._20_4_;
              auVar55._24_4_ = local_1440._24_4_ * auVar70._24_4_;
              auVar55._28_4_ = auVar70._28_4_;
              auVar70 = vminps_avx(auVar55,auVar134);
              auVar119 = vsubps_avx(auVar134,auVar72);
              auVar15 = vsubps_avx(auVar134,auVar70);
              local_12c0 = vblendvps_avx(auVar70,auVar119,local_15c0);
              local_12e0 = vblendvps_avx(auVar72,auVar15,local_15c0);
              local_1280._4_4_ = fVar88 * (float)local_1420._4_4_;
              local_1280._0_4_ = fVar82 * (float)local_1420._0_4_;
              local_1280._8_4_ = fVar89 * fStack_1418;
              local_1280._12_4_ = fVar90 * fStack_1414;
              local_1280._16_4_ = fVar91 * fStack_1410;
              local_1280._20_4_ = fVar92 * fStack_140c;
              local_1280._24_4_ = fVar93 * fStack_1408;
              local_1280._28_4_ = local_12c0._28_4_;
              local_1260[0] = fVar130 * (float)local_1420._0_4_;
              local_1260[1] = fVar136 * (float)local_1420._4_4_;
              local_1260[2] = fVar137 * fStack_1418;
              local_1260[3] = fVar138 * fStack_1414;
              fStack_1250 = fVar139 * fStack_1410;
              fStack_124c = fVar140 * fStack_140c;
              fStack_1248 = fVar141 * fStack_1408;
              uStack_1244 = local_12e0._28_4_;
              local_1240[0] = (float)local_1420._0_4_ * fVar94;
              local_1240[1] = (float)local_1420._4_4_ * fVar98;
              local_1240[2] = fStack_1418 * fVar99;
              local_1240[3] = fStack_1414 * fVar100;
              fStack_1230 = fStack_1410 * fVar101;
              fStack_122c = fStack_140c * fVar102;
              fStack_1228 = fStack_1408 * fVar103;
              uStack_1224 = local_1320._28_4_;
              auVar69 = vpsllw_avx(auVar69,0xf);
              auVar69 = vpacksswb_avx(auVar69,auVar69);
              uVar56 = (ulong)(byte)(SUB161(auVar69 >> 7,0) & 1 |
                                     (SUB161(auVar69 >> 0xf,0) & 1) << 1 |
                                     (SUB161(auVar69 >> 0x17,0) & 1) << 2 |
                                     (SUB161(auVar69 >> 0x1f,0) & 1) << 3 |
                                     (SUB161(auVar69 >> 0x27,0) & 1) << 4 |
                                     (SUB161(auVar69 >> 0x2f,0) & 1) << 5 |
                                     (SUB161(auVar69 >> 0x37,0) & 1) << 6 |
                                    SUB161(auVar69 >> 0x3f,0) << 7);
              auVar129 = ZEXT3264(local_1480);
              auVar135 = ZEXT3264(local_14a0);
              auVar146 = ZEXT3264(local_14c0);
              auVar161 = ZEXT3264(local_14e0);
              auVar164 = ZEXT3264(local_1500);
              auVar173 = ZEXT3264(local_1520);
              auVar181 = ZEXT3264(local_1540);
              auVar97 = ZEXT3264(local_1560);
              auVar87 = ZEXT3264(local_1580);
              auVar110 = ZEXT3264(local_15a0);
              auVar184 = ZEXT3264(local_15e0);
              local_16e0 = context->scene;
              pSVar60 = context->scene;
              local_1680 = auVar21;
              do {
                uVar59 = 0;
                if (uVar56 != 0) {
                  for (; (uVar56 >> uVar59 & 1) == 0; uVar59 = uVar59 + 1) {
                  }
                }
                local_1748 = *(uint *)((long)&local_13e0 + uVar59 * 4);
                pGVar5 = (pSVar60->geometries).items[local_1748].ptr;
                if ((pGVar5->mask & ray->mask) == 0) {
                  uVar56 = uVar56 ^ 1L << (uVar59 & 0x3f);
                }
                else {
                  local_1780 = uVar59;
                  local_1700 = uVar56;
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar5->occlusionFilterN == (RTCFilterFunctionN)0x0)) goto LAB_002eb4e8;
                  local_17a0._0_8_ = context->args;
                  local_1660._0_8_ = uVar65;
                  local_1640._0_8_ = uVar64;
                  local_1620._0_8_ = puVar63;
                  local_1730.context = context->user;
                  local_1760 = *(undefined4 *)(local_1280 + uVar59 * 4);
                  local_175c = local_1260[uVar59];
                  local_1758 = local_1240[uVar59];
                  local_1754 = *(undefined4 *)(local_12e0 + uVar59 * 4);
                  local_1750 = *(undefined4 *)(local_12c0 + uVar59 * 4);
                  local_174c = *(undefined4 *)((long)&local_1400 + uVar59 * 4);
                  local_1744 = (local_1730.context)->instID[0];
                  local_1740 = (local_1730.context)->instPrimID[0];
                  local_1680._0_4_ = ray->tfar;
                  ray->tfar = *(float *)(local_12a0 + uVar59 * 4);
                  local_17ac = -1;
                  local_1730.valid = &local_17ac;
                  local_1730.geometryUserPtr = pGVar5->userPtr;
                  local_16c0._0_8_ = ray;
                  local_1730.hit = (RTCHitN *)&local_1760;
                  local_1730.N = 1;
                  local_16a0._0_8_ = pGVar5;
                  local_1730.ray = (RTCRayN *)ray;
                  if ((pGVar5->occlusionFilterN == (RTCFilterFunctionN)0x0) ||
                     ((*pGVar5->occlusionFilterN)(&local_1730), *local_1730.valid != 0)) {
                    ray = (Ray *)local_16c0._0_8_;
                    if ((*(code **)(local_17a0._0_8_ + 0x10) == (code *)0x0) ||
                       (((*(byte *)local_17a0._0_8_ & 2) == 0 &&
                        ((*(byte *)(local_16a0._0_8_ + 0x3e) & 0x40) == 0)))) {
LAB_002eb4e8:
                      ray->tfar = -INFINITY;
                      return;
                    }
                    (**(code **)(local_17a0._0_8_ + 0x10))(&local_1730);
                    ray = (Ray *)local_16c0._0_8_;
                    if (*local_1730.valid != 0) goto LAB_002eb4e8;
                  }
                  *(undefined4 *)(local_16c0._0_8_ + 0x20) = local_1680._0_4_;
                  uVar56 = local_1700 ^ 1L << (local_1780 & 0x3f);
                  auVar129 = ZEXT3264(local_1480);
                  auVar135 = ZEXT3264(local_14a0);
                  auVar146 = ZEXT3264(local_14c0);
                  auVar161 = ZEXT3264(local_14e0);
                  auVar164 = ZEXT3264(local_1500);
                  auVar173 = ZEXT3264(local_1520);
                  auVar181 = ZEXT3264(local_1540);
                  auVar97 = ZEXT3264(local_1560);
                  auVar87 = ZEXT3264(local_1580);
                  auVar110 = ZEXT3264(local_15a0);
                  auVar122 = ZEXT3264(local_15c0);
                  auVar184 = ZEXT3264(local_15e0);
                  ray = (Ray *)local_16c0._0_8_;
                  puVar63 = (ulong *)local_1620._0_8_;
                  uVar64 = local_1640._0_8_;
                  uVar65 = local_1660._0_8_;
                }
                pSVar60 = local_16e0;
              } while (uVar56 != 0);
              lVar61 = local_1600._0_8_;
            }
            lVar61 = lVar61 + 1;
          } while (lVar61 != local_17a8);
        }
LAB_002eb4cd:
      } while (puVar63 != &local_1200);
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::occluded(const Accel::Intersectors* __restrict__ This,
                                                                             Ray& __restrict__ ray,
                                                                             RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
       
      /* early out for already occluded rays */
      if (unlikely(ray.tfar < 0.0f))
        return;

      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      NodeRef stack[stackSize];    // stack of nodes that still need to get traversed
      NodeRef* stackPtr = stack+1; // current stack pointer
      NodeRef* stackEnd = stack+stackSize;
      stack[0] = bvh->root;

      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif

      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = (NodeRef)*stackPtr;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(shadow.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(shadow.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        if (PrimitiveIntersector1::occluded(This, pre, ray, context, prim, num, tray, lazy_node)) {
          ray.tfar = neg_inf;
          break;
        }

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          *stackPtr = (NodeRef)lazy_node;
          stackPtr++;
        }
      }
    }